

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O2

int checkForTemps(LayerStack *g,uint64_t seed,int x,int z,int w,int h,int *tc)

{
  int *piVar1;
  int *piVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  int iVar5;
  uint64_t ss;
  uint64_t uVar6;
  size_t __nmemb;
  int *out;
  ulong uVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  Layer *layer;
  int x_00;
  ulong uVar14;
  bool bVar15;
  int ccnt [9];
  
  ss = getStartSeed(seed,0x6957b26727512035);
  iVar10 = 0;
  iVar5 = tc[6];
  if (tc[6] < 1) {
    iVar5 = 0;
  }
  iVar9 = tc[7];
  if (tc[7] < 1) {
    iVar9 = 0;
  }
  iVar13 = tc[8];
  if (iVar13 < 1) {
    iVar13 = 0;
  }
  iVar13 = iVar13 + iVar9 + iVar5;
  if (iVar13 != 0) {
    iVar5 = 0;
    if (0 < w) {
      iVar5 = w;
    }
    iVar9 = 0;
    if (0 < h) {
      iVar9 = h;
    }
    for (; iVar10 != iVar9; iVar10 = iVar10 + 1) {
      x_00 = x;
      iVar12 = iVar5;
      while (bVar15 = iVar12 != 0, iVar12 = iVar12 + -1, bVar15) {
        uVar6 = getChunkSeed(ss,x_00,iVar10 + z);
        auVar3._8_8_ = (long)uVar6 >> 0x3f;
        auVar3._0_8_ = (long)uVar6 >> 0x18;
        iVar13 = iVar13 - (uint)(SUB168(auVar3 % SEXT816(0xd),0) == 0);
        x_00 = x_00 + 1;
      }
    }
    if (0 < iVar13) {
      return 0;
    }
  }
  layer = g->layers + 0xe;
  ccnt[4] = 0;
  ccnt[5] = 0;
  ccnt[6] = 0;
  ccnt[7] = 0;
  ccnt[0] = 0;
  ccnt[1] = 0;
  ccnt[2] = 0;
  ccnt[3] = 0;
  ccnt[8] = 0;
  __nmemb = getMinLayerCacheSize(layer,w,h);
  out = (int *)calloc(__nmemb,4);
  setLayerSeed(layer,seed);
  genArea(layer,out,x,z,w,h);
  uVar7 = 0;
  uVar14 = (ulong)(uint)(h * w);
  if (h * w < 1) {
    uVar14 = 0;
  }
  for (; uVar14 != uVar7; uVar7 = uVar7 + 1) {
    uVar11 = out[uVar7] & 0xff;
    uVar4 = uVar11 + 5;
    if (uVar11 == 4) {
      uVar4 = uVar11;
    }
    if ((uint)out[uVar7] < 0x100) {
      uVar4 = uVar11;
    }
    ccnt[uVar4] = ccnt[uVar4] + 1;
  }
  lVar8 = 0;
  iVar5 = 0;
  while (lVar8 != 9) {
    piVar2 = ccnt + lVar8;
    piVar1 = tc + lVar8;
    if ((*piVar2 < *piVar1) || (lVar8 = lVar8 + 1, *piVar1 < 0 && *piVar2 != 0)) goto LAB_0010efa1;
  }
  iVar5 = 1;
LAB_0010efa1:
  free(out);
  return iVar5;
}

Assistant:

int checkForTemps(LayerStack *g, uint64_t seed, int x, int z, int w, int h, const int tc[9])
{
    uint64_t ls = getLayerSalt(3); // L_SPECIAL_1024 layer seed
    uint64_t ss = getStartSeed(seed, ls);

    int i, j;
    int scnt = 0;

    if (tc[Special+Warm] > 0) scnt += tc[Special+Warm];
    if (tc[Special+Lush] > 0) scnt += tc[Special+Lush];
    if (tc[Special+Cold] > 0) scnt += tc[Special+Cold];

    if (scnt > 0)
    {
        for (j = 0; j < h; j++)
        {
            for (i = 0; i < w; i++)
            {
                if (mcFirstIsZero(getChunkSeed(ss, x+i, z+j), 13))
                    scnt--;
            }
        }
        if (scnt > 0)
            return 0;
    }

    Layer *l = &g->layers[L_SPECIAL_1024];
    int ccnt[9] = {0};
    int *area = (int*) calloc(getMinLayerCacheSize(l, w, h), sizeof(int));
    int ret = 1;

    setLayerSeed(l, seed);
    genArea(l, area, x, z, w, h);

    for (i = 0; i < w*h; i++)
    {
        int id = area[i];
        int t = id & 0xff;
        if (id != t && t != Freezing)
            t += Special;
        ccnt[t]++;
    }
    for (i = 0; i < 9; i++)
    {
        if (ccnt[i] < tc[i] || (ccnt[i] && tc[i] < 0))
        {
            ret = 0;
            break;
        }
    }

    free(area);
    return ret;
}